

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

void __thiscall
wallet::LegacyDataSPKM::LoadKeyPool(LegacyDataSPKM *this,int64_t nIndex,CKeyPool *keypool)

{
  long lVar1;
  CKeyMetadata *this_00;
  CPubKey *this_01;
  mapped_type *pmVar2;
  CKeyMetadata *this_02;
  mapped_type *pmVar3;
  long in_RDX;
  key_type *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  CKeyID keyid;
  CKeyMetadata *in_stack_fffffffffffffe88;
  key_type *in_stack_fffffffffffffe90;
  map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
  *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffec8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffec8,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
             ,in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x18,0));
  if ((*(byte *)(in_RDX + 0x4a) & 1) == 0) {
    if ((*(byte *)(in_RDX + 0x49) & 1) == 0) {
      std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffe98,
                 (value_type_conflict4 *)in_stack_fffffffffffffe90);
    }
    else {
      std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffe98,
                 (value_type_conflict4 *)in_stack_fffffffffffffe90);
    }
  }
  else {
    std::set<long,_std::less<long>,_std::allocator<long>_>::insert
              ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffe98,
               (value_type_conflict4 *)in_stack_fffffffffffffe90);
  }
  this_00 = (CKeyMetadata *)
            std::max<long>((long *)in_stack_fffffffffffffe90,(long *)in_stack_fffffffffffffe88);
  *(long *)(in_RDI + 0x2f0) = *(long *)this_00;
  this_01 = (CPubKey *)(in_RDI + 0x2f8);
  CPubKey::GetID(this_01);
  pmVar2 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[]((map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>
                       *)this_01,in_RSI);
  *pmVar2 = (mapped_type)in_RSI;
  CPubKey::GetID(this_01);
  this_02 = (CKeyMetadata *)
            std::
            map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
            ::count(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (this_02 == (CKeyMetadata *)0x0) {
    CKeyMetadata::CKeyMetadata(this_00,(int64_t)this_01);
    pmVar3 = std::
             map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
             ::operator[]((map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
                           *)this_01,in_RSI);
    CKeyMetadata::operator=(this_02,pmVar3);
    CKeyMetadata::~CKeyMetadata(in_stack_fffffffffffffe88);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void LegacyDataSPKM::LoadKeyPool(int64_t nIndex, const CKeyPool &keypool)
{
    LOCK(cs_KeyStore);
    if (keypool.m_pre_split) {
        set_pre_split_keypool.insert(nIndex);
    } else if (keypool.fInternal) {
        setInternalKeyPool.insert(nIndex);
    } else {
        setExternalKeyPool.insert(nIndex);
    }
    m_max_keypool_index = std::max(m_max_keypool_index, nIndex);
    m_pool_key_to_index[keypool.vchPubKey.GetID()] = nIndex;

    // If no metadata exists yet, create a default with the pool key's
    // creation time. Note that this may be overwritten by actually
    // stored metadata for that key later, which is fine.
    CKeyID keyid = keypool.vchPubKey.GetID();
    if (mapKeyMetadata.count(keyid) == 0)
        mapKeyMetadata[keyid] = CKeyMetadata(keypool.nTime);
}